

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void VP8LHistogramCreate(VP8LHistogram *p,VP8LBackwardRefs *refs,int palette_code_bits)

{
  int iVar1;
  uint32_t *puVar2;
  int iVar3;
  
  if (-1 < palette_code_bits) {
    p->palette_code_bits_ = palette_code_bits;
  }
  iVar1 = p->palette_code_bits_;
  puVar2 = p->literal_;
  iVar3 = (4 << ((byte)iVar1 & 0x1f)) + 0x1138;
  if (iVar1 < 1) {
    iVar3 = 0x1138;
  }
  memset(p,0,(long)iVar3);
  p->palette_code_bits_ = iVar1;
  p->literal_ = puVar2;
  VP8LHistogramStoreRefs(refs,p);
  return;
}

Assistant:

void VP8LHistogramCreate(VP8LHistogram* const p,
                         const VP8LBackwardRefs* const refs,
                         int palette_code_bits) {
  if (palette_code_bits >= 0) {
    p->palette_code_bits_ = palette_code_bits;
  }
  HistogramClear(p);
  VP8LHistogramStoreRefs(refs, p);
}